

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

void __thiscall icu_63::TransliteratorSpec::setupNext(TransliteratorSpec *this)

{
  UnicodeString *this_00;
  uint uVar1;
  __off_t in_RDX;
  __off_t __length;
  
  this->isNextLocale = '\0';
  if (this->isSpecLocale == '\0') {
    icu_63::UnicodeString::truncate(&this->nextSpec,(char *)0x0,in_RDX);
    return;
  }
  this_00 = &this->nextSpec;
  icu_63::UnicodeString::operator=(this_00,&this->spec);
  uVar1 = icu_63::UnicodeString::lastIndexOf(this_00,L'_');
  if (0 < (int)uVar1) {
    icu_63::UnicodeString::truncate(this_00,(char *)(ulong)uVar1,__length);
    this->isNextLocale = '\x01';
    return;
  }
  icu_63::UnicodeString::operator=(this_00,&this->scriptName);
  return;
}

Assistant:

void TransliteratorSpec::setupNext() {
    isNextLocale = FALSE;
    if (isSpecLocale) {
        nextSpec = spec;
        int32_t i = nextSpec.lastIndexOf(LOCALE_SEP);
        // If i == 0 then we have _FOO, so we fall through
        // to the scriptName.
        if (i > 0) {
            nextSpec.truncate(i);
            isNextLocale = TRUE;
        } else {
            nextSpec = scriptName; // scriptName may be empty
        }
    } else {
        // spec is a script, so we are at the end
        nextSpec.truncate(0);
    }
}